

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O0

double __thiscall cmCTestRunTest::ResolveTimeout(cmCTestRunTest *this)

{
  int iVar1;
  uint uVar2;
  cmCTest *this_00;
  bool bVar3;
  time_t tVar4;
  undefined8 uVar5;
  ostream *this_01;
  char *msg;
  int iVar6;
  cmCTestRunTest *local_698;
  cmCTestRunTest *local_690;
  string local_640 [32];
  ostringstream local_620 [8];
  ostringstream cmCTestLog_msg;
  time_t tStack_4a0;
  int stop_timeout;
  time_t stop_time;
  char local_478 [8];
  char buf [1024];
  int tzone_offset;
  int local_hour;
  time_t gm_time;
  time_t tStack_60;
  int gm_hour;
  time_t current_time;
  tm *lctime;
  string local_40;
  cmCTestRunTest *local_20;
  double timeout;
  cmCTestRunTest *this_local;
  
  local_20 = (cmCTestRunTest *)this->TestProperties->Timeout;
  timeout = (double)this;
  cmCTest::GetStopTime_abi_cxx11_(&local_40,this->CTest);
  bVar3 = std::operator==(&local_40,"");
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar3) {
    this_local = local_20;
  }
  else {
    tStack_60 = time((time_t *)0x0);
    current_time = (time_t)gmtime(&stack0xffffffffffffffa0);
    iVar6 = ((tm *)current_time)->tm_hour;
    tVar4 = mktime((tm *)current_time);
    current_time = (time_t)localtime(&stack0xffffffffffffffa0);
    buf._1020_4_ = ((tm *)current_time)->tm_hour;
    buf._1016_4_ = buf._1020_4_ - iVar6;
    if ((tStack_60 < tVar4) && (iVar6 < (int)buf._1020_4_)) {
      buf._1016_4_ = buf._1016_4_ + -0x18;
    }
    else if ((tVar4 < tStack_60) && ((int)buf._1020_4_ < iVar6)) {
      buf._1016_4_ = buf._1016_4_ + 0x18;
    }
    buf._1016_4_ = buf._1016_4_ * 100;
    iVar6 = ((tm *)current_time)->tm_year;
    iVar1 = ((tm *)current_time)->tm_mon;
    uVar2 = ((tm *)current_time)->tm_mday;
    cmCTest::GetStopTime_abi_cxx11_((string *)&stop_time,this->CTest);
    uVar5 = std::__cxx11::string::c_str();
    sprintf(local_478,"%d%02d%02d %s %+05i",(ulong)(iVar6 + 0x76c),(ulong)(iVar1 + 1),(ulong)uVar2,
            uVar5,buf._1016_4_);
    std::__cxx11::string::~string((string *)&stop_time);
    tStack_4a0 = curl_getdate(local_478,&stack0xffffffffffffffa0);
    if (tStack_4a0 == -1) {
      this_local = local_20;
    }
    else {
      if ((this->CTest->NextDayStopTime & 1U) != 0) {
        tStack_4a0 = tStack_4a0 + 0x15180;
      }
      iVar6 = ((int)tStack_4a0 - (int)tStack_60) % 0x15180;
      this->CTest->LastStopTimeout = iVar6;
      if ((iVar6 < 1) || (this->CTest->LastStopTimeout < iVar6)) {
        std::__cxx11::ostringstream::ostringstream(local_620);
        this_01 = std::operator<<((ostream *)local_620,
                                  "The stop time has been passed. Stopping all tests.");
        std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
        this_00 = this->CTest;
        std::__cxx11::ostringstream::str();
        msg = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(this_00,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0x2a6,msg,false);
        std::__cxx11::string::~string(local_640);
        std::__cxx11::ostringstream::~ostringstream(local_620);
        this->StopTimePassed = true;
        this_local = (cmCTestRunTest *)0x0;
      }
      else {
        if (((double)local_20 != 0.0) || (NAN((double)local_20))) {
          if ((double)iVar6 <= (double)local_20) {
            local_698 = (cmCTestRunTest *)(double)iVar6;
          }
          else {
            local_698 = local_20;
          }
          local_690 = local_698;
        }
        else {
          local_690 = (cmCTestRunTest *)(double)iVar6;
        }
        this_local = local_690;
      }
    }
  }
  return (double)this_local;
}

Assistant:

double cmCTestRunTest::ResolveTimeout()
{
  double timeout = this->TestProperties->Timeout;

  if(this->CTest->GetStopTime() == "")
    {
    return timeout;
    }
  struct tm* lctime;
  time_t current_time = time(0);
  lctime = gmtime(&current_time);
  int gm_hour = lctime->tm_hour;
  time_t gm_time = mktime(lctime);
  lctime = localtime(&current_time);
  int local_hour = lctime->tm_hour;

  int tzone_offset = local_hour - gm_hour;
  if(gm_time > current_time && gm_hour < local_hour)
    {
    // this means gm_time is on the next day
    tzone_offset -= 24;
    }
  else if(gm_time < current_time && gm_hour > local_hour)
    {
    // this means gm_time is on the previous day
    tzone_offset += 24;
    }

  tzone_offset *= 100;
  char buf[1024];
  // add todays year day and month to the time in str because
  // curl_getdate no longer assumes the day is today
  sprintf(buf, "%d%02d%02d %s %+05i",
          lctime->tm_year + 1900,
          lctime->tm_mon + 1,
          lctime->tm_mday,
          this->CTest->GetStopTime().c_str(),
          tzone_offset);

  time_t stop_time = curl_getdate(buf, &current_time);
  if(stop_time == -1)
    {
    return timeout;
    }

  //the stop time refers to the next day
  if(this->CTest->NextDayStopTime)
    {
    stop_time += 24*60*60;
    }
  int stop_timeout = static_cast<int>(stop_time - current_time) % (24*60*60);
  this->CTest->LastStopTimeout = stop_timeout;

  if(stop_timeout <= 0 || stop_timeout > this->CTest->LastStopTimeout)
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "The stop time has been passed. "
      "Stopping all tests." << std::endl);
    this->StopTimePassed = true;
    return 0;
    }
  return timeout == 0 ? stop_timeout :
    (timeout < stop_timeout ? timeout : stop_timeout);
}